

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermPartialOrdering.cpp
# Opt level: O2

PoComp __thiscall
Kernel::TermPartialOrdering::getOneExternal(TermPartialOrdering *this,TermList t,size_t idx)

{
  Entry *pEVar1;
  MaybeUninit<unsigned_long> *pMVar2;
  Entry *pEVar3;
  bool bVar4;
  PoComp PVar5;
  int iVar6;
  uint uVar7;
  PoComp res;
  Iterator local_48;
  
  res = UNKNOWN;
  local_48._last = (this->_nodes)._afterLast;
  local_48._next = (this->_nodes)._entries;
  do {
    while( true ) {
      do {
        bVar4 = Lib::Map<Kernel::TermList,_unsigned_long,_Lib::DefaultHash>::Iterator::hasNext
                          (&local_48);
        pEVar3 = local_48._next;
        if (!bVar4) {
          return res;
        }
        pEVar1 = local_48._next + 1;
        pMVar2 = &(local_48._next)->_value;
        local_48._next = pEVar1;
      } while ((*pMVar2 == (MaybeUninit<unsigned_long>)idx) ||
              (PVar5 = PartialOrdering::get(this->_po,(size_t)*pMVar2,idx), PVar5 == UNKNOWN));
      iVar6 = (*this->_ord->_vptr_Ordering[3])(this->_ord,t._content,pEVar3->_key);
      uVar7 = (uint)PVar5;
      if (iVar6 == 1) break;
      if (iVar6 == 2) {
        if ((PVar5 == NGEQ) || (uVar7 == 6)) {
          PVar5 = NGEQ;
LAB_00499741:
          checkCompatibility(res,PVar5,&res);
          if (res == INCOMPARABLE) {
            return INCOMPARABLE;
          }
        }
        else if (uVar7 - 2 < 2) {
          PVar5 = LESS;
          goto LAB_00499795;
        }
      }
      else if (iVar6 == 3) {
        return PVar5;
      }
    }
    if (PVar5 - 5 < 2) {
      PVar5 = NLEQ;
      goto LAB_00499741;
    }
  } while (1 < uVar7 - 1);
  PVar5 = GREATER;
LAB_00499795:
  checkCompatibility(res,PVar5,&res);
  return res;
}

Assistant:

PoComp TermPartialOrdering::getOneExternal(TermList t, size_t idx) const
{
  PoComp res = PoComp::UNKNOWN;
  decltype(_nodes)::Iterator it(_nodes);
  while (it.hasNext()) {
    auto& e = it.next();
    if (e.value()==idx) {
      continue;
    }
    auto val = _po->get(e.value(),idx);
    if (val == PoComp::UNKNOWN) {
      continue;
    }
    auto comp = _ord.compare(t,e.key());
    switch (comp) {
      case Ordering::GREATER: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::GREATER:
            // t > e ≥ x -> t > x
            ALWAYS(checkCompatibility(res, PoComp::GREATER, res));
            return res;
          case PoComp::NLEQ:
          case PoComp::INCOMPARABLE:
            // t > e ≰ x -> t ≰ x
            ALWAYS(checkCompatibility(res, PoComp::NLEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::EQUAL: {
        return val;
      }
      case Ordering::LESS: {
        switch (val) {
          case PoComp::EQUAL:
          case PoComp::LESS:
            // t < e ≤ x -> t < x
            ALWAYS(checkCompatibility(res, PoComp::LESS, res));
            return res;
          case PoComp::NGEQ:
          case PoComp::INCOMPARABLE:
            // t < e ≱ x -> t ≱ x
            ALWAYS(checkCompatibility(res, PoComp::NGEQ, res));
            if (res == PoComp::INCOMPARABLE) {
              return res;
            }
          default:
            break;
        }
        break;
      }
      case Ordering::INCOMPARABLE: {
        break;
      }
    }
  }
  return res;
}